

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

BVSparse<Memory::JitArenaAllocator> * __thiscall
HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::GetAndClear
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *this,int value)

{
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
  *pSVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  DictionaryStats *this_00;
  bool bVar3;
  uint uVar4;
  Type *pTVar5;
  byte local_69;
  BVSparse<Memory::JitArenaAllocator> *retVal;
  Bucket<BVSparse<Memory::JitArenaAllocator>_*> *bucket;
  EditingIterator iter;
  bool first;
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount> *list;
  int value_local;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *this_local;
  
  pSVar1 = this->table;
  uVar4 = Hash(this,value);
  iter.last._7_1_ = 1;
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>::
  GetEditingIterator((EditingIterator *)&bucket,pSVar1 + uVar4);
  while( true ) {
    bVar3 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)&bucket);
    if (!bVar3) {
      return (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
    pTVar5 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)&bucket);
    if (pTVar5->value <= value) break;
    iter.last._7_1_ = 0;
  }
  if (pTVar5->value != value) {
    return (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  pBVar2 = pTVar5->element;
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>::
  EditingIterator::RemoveCurrent((EditingIterator *)&bucket,this->alloc);
  if (this->stats != (DictionaryStats *)0x0) {
    this_00 = this->stats;
    local_69 = 0;
    if ((iter.last._7_1_ & 1) != 0) {
      bVar3 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
              ::EditingIterator::Next((EditingIterator *)&bucket);
      local_69 = bVar3 ^ 0xff;
    }
    DictionaryStats::Remove(this_00,(bool)(local_69 & 1));
    return pBVar2;
  }
  return pBVar2;
}

Assistant:

T GetAndClear(int value)
    {
        SListBase<Bucket<T>> * list = &this->table[this->Hash(value)];

#if PROFILE_DICTIONARY
        bool first = true;
#endif
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, list, iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    T retVal = bucket.element;
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                    return retVal;
                }
                break;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
        return T();
    }